

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_bds.cpp
# Opt level: O2

void BDS::ComputeAofs(MultiFab *aofs,int aofs_comp,int ncomp,MultiFab *state,int state_comp,
                     MultiFab *umac,MultiFab *vmac,MultiFab *wmac,MultiFab *xedge,MultiFab *yedge,
                     MultiFab *zedge,int edge_comp,bool known_edgestate,MultiFab *xfluxes,
                     MultiFab *yfluxes,MultiFab *zfluxes,int fluxes_comp,MultiFab *fq,int fq_comp,
                     MultiFab *divu,BCRec *d_bc,Geometry *geom,
                     Vector<int,_std::allocator<int>_> *iconserv,Real dt,bool is_velocity)

{
  int iVar1;
  int *piVar2;
  double dVar3;
  int iVar4;
  pointer piVar5;
  Geometry geom_00;
  FabArray<amrex::FArrayBox> *this;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  size_t __n;
  long lVar13;
  int iVar14;
  Geometry *pGVar15;
  uint uVar16;
  undefined8 *puVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  byte bVar22;
  undefined1 auVar23 [88];
  undefined1 auVar24 [48];
  undefined1 in_stack_fffffffffffff7a0 [160];
  undefined1 auVar25 [24];
  undefined8 in_stack_fffffffffffff840;
  Array4<const_double> *in_stack_fffffffffffff848;
  Array4<double> *in_stack_fffffffffffff850;
  Array4<const_double> *in_stack_fffffffffffff858;
  Array4<const_double> *in_stack_fffffffffffff860;
  int local_76c;
  long local_760;
  long local_758;
  long local_750;
  long local_748;
  long local_740;
  Box local_704;
  FabArray<amrex::FArrayBox> *local_6e8;
  FabArray<amrex::FArrayBox> *local_6e0;
  long local_6d8;
  long local_6d0;
  long local_6c8;
  long local_6c0;
  double *local_6b8;
  long local_6b0;
  int *local_6a8;
  Array4<const_double> local_6a0;
  Real local_660;
  FabArray<amrex::FArrayBox> *local_658;
  long local_650;
  long local_648;
  long local_640;
  long local_638;
  double *local_630;
  long local_628;
  long local_620;
  double *local_618;
  long local_610;
  long local_608;
  ulong local_600;
  long local_5f8;
  long local_5f0;
  long local_5e8;
  long local_5e0;
  long local_5d8;
  long local_5d0;
  long local_5c8;
  long local_5c0;
  double *local_5b8;
  double *local_5b0;
  long local_5a8;
  long local_5a0;
  long local_598;
  long local_590;
  long local_588;
  long local_580;
  long local_578;
  long local_570;
  long local_568;
  long local_560;
  ulong local_558;
  double *local_550;
  double *local_548;
  double *local_540;
  long local_538;
  ulong local_530;
  Array4<const_double> local_528;
  Array4<double> local_4e8;
  Array4<double> local_4a8;
  Array4<double> local_468;
  DeviceVector<int> iconserv_d;
  Array4<const_double> local_410;
  Array<const_MultiFab_*,_3> u;
  int local_3a8;
  Array4<double> local_370;
  Array4<double> local_330;
  Array4<double> local_2f0;
  Array4<const_double> local_2b0;
  Array4<const_double> local_270;
  Array4<const_double> local_230;
  Array4<const_double> local_1f0;
  MultiFab divu_mac;
  
  bVar22 = 0;
  local_6e8 = &state->super_FabArray<amrex::FArrayBox>;
  local_6e0 = &umac->super_FabArray<amrex::FArrayBox>;
  local_660 = dt;
  amrex::PODVector<int,_std::allocator<int>_>::PODVector
            (&iconserv_d,
             (long)(iconserv->super_vector<int,_std::allocator<int>_>).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_finish -
             (long)(iconserv->super_vector<int,_std::allocator<int>_>).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start >> 2);
  piVar5 = (iconserv->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  __n = (long)(iconserv->super_vector<int,_std::allocator<int>_>).
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish - (long)piVar5;
  if (__n != 0) {
    memcpy(iconserv_d.m_data,piVar5,__n);
  }
  local_6a8 = iconserv_d.m_data;
  u._M_elems[0] = (MultiFab *)0x1;
  u._M_elems[1] = (MultiFab *)0x0;
  u._M_elems[2] = (MultiFab *)0x0;
  local_370.p = (double *)&PTR__FabFactory_006d8928;
  amrex::MultiFab::MultiFab
            (&divu_mac,
             &(((FabArray<amrex::FArrayBox> *)&local_6e8->super_FabArrayBase)->super_FabArrayBase).
              boxarray,
             &(((FabArray<amrex::FArrayBox> *)&local_6e8->super_FabArrayBase)->super_FabArrayBase).
              distributionMap,1,0,(MFInfo *)&u,(FabFactory<amrex::FArrayBox> *)&local_370);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(u._M_elems + 2));
  piVar5 = (iconserv->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  lVar11 = (long)(iconserv->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish - (long)piVar5 >> 2;
  lVar12 = 0;
  if (lVar11 < 1) {
    lVar11 = lVar12;
  }
  do {
    if (lVar11 == lVar12) goto LAB_002997d4;
    piVar2 = piVar5 + lVar12;
    lVar12 = lVar12 + 1;
  } while (*piVar2 != 0);
  u._M_elems[0] = (MultiFab *)local_6e0;
  u._M_elems[1] = vmac;
  u._M_elems[2] = wmac;
  amrex::computeDivergence(&divu_mac,&u,geom);
LAB_002997d4:
  local_658 = &aofs->super_FabArray<amrex::FArrayBox>;
  amrex::MFIter::MFIter((MFIter *)&u,(FabArrayBase *)aofs,true);
  local_600 = 0;
  if (0 < ncomp) {
    local_600 = (ulong)(uint)ncomp;
  }
  while( true ) {
    if (local_3a8 < 1) break;
    amrex::MFIter::tilebox(&local_704,(MFIter *)&u);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_370,&xfluxes->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,fluxes_comp);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_2f0,&yfluxes->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,fluxes_comp);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_330,&zfluxes->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,fluxes_comp);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_468,&xedge->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,edge_comp);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_4a8,&yedge->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,edge_comp);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_4e8,&zedge->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,edge_comp);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_270,local_6e0,(MFIter *)&u);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_1f0,&vmac->super_FabArray<amrex::FArrayBox>,(MFIter *)&u);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_230,&wmac->super_FabArray<amrex::FArrayBox>,(MFIter *)&u);
    if (!known_edgestate) {
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_528,local_6e8,(MFIter *)&u,state_comp);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_6a0,&divu->super_FabArray<amrex::FArrayBox>,(MFIter *)&u);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_410,&fq->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,fq_comp);
      pGVar15 = geom;
      puVar17 = (undefined8 *)&stack0xfffffffffffff7a0;
      for (lVar12 = 0x19; lVar12 != 0; lVar12 = lVar12 + -1) {
        *puVar17 = *(undefined8 *)&pGVar15->super_CoordSys;
        pGVar15 = (Geometry *)((long)pGVar15 + (ulong)bVar22 * -0x10 + 8);
        puVar17 = puVar17 + (ulong)bVar22 * -2 + 1;
      }
      geom_00.roundoff_hi_f.arr[0] = (float)(int)in_stack_fffffffffffff840;
      geom_00.roundoff_hi_f.arr[1] = (float)(int)((ulong)in_stack_fffffffffffff840 >> 0x20);
      auVar23 = in_stack_fffffffffffff7a0._0_88_;
      auVar24 = in_stack_fffffffffffff7a0._88_48_;
      auVar25 = in_stack_fffffffffffff7a0._136_24_;
      geom_00.super_CoordSys.c_sys = auVar23._0_4_;
      geom_00.super_CoordSys._4_4_ = auVar23._4_4_;
      geom_00.super_CoordSys.offset[0] = (Real)auVar23._8_8_;
      geom_00.super_CoordSys.offset[1] = (Real)auVar23._16_8_;
      geom_00.super_CoordSys.offset[2] = (Real)auVar23._24_8_;
      geom_00.super_CoordSys.dx[0] = (Real)auVar23._32_8_;
      geom_00.super_CoordSys.dx[1] = (Real)auVar23._40_8_;
      geom_00.super_CoordSys.dx[2] = (Real)auVar23._48_8_;
      geom_00.super_CoordSys.inv_dx[0] = (Real)auVar23._56_8_;
      geom_00.super_CoordSys.inv_dx[1] = (Real)auVar23._64_8_;
      geom_00.super_CoordSys.inv_dx[2] = (Real)auVar23._72_8_;
      geom_00.super_CoordSys.ok = (bool)auVar23[0x50];
      geom_00.super_CoordSys._81_7_ = auVar23._81_7_;
      geom_00.prob_domain.xlo[0] = (Real)auVar24._0_8_;
      geom_00.prob_domain.xlo[1] = (Real)auVar24._8_8_;
      geom_00.prob_domain.xlo[2] = (Real)auVar24._16_8_;
      geom_00.prob_domain.xhi[0] = (Real)auVar24._24_8_;
      geom_00.prob_domain.xhi[1] = (Real)auVar24._32_8_;
      geom_00.prob_domain.xhi[2] = (Real)auVar24._40_8_;
      geom_00.roundoff_hi_d.arr[0] = (double)auVar25._0_8_;
      geom_00.roundoff_hi_d.arr[1] = (double)auVar25._8_8_;
      geom_00.roundoff_hi_d.arr[2] = (double)auVar25._16_8_;
      geom_00._168_8_ = in_stack_fffffffffffff848;
      geom_00.domain.smallend.vect._4_8_ = in_stack_fffffffffffff850;
      geom_00.domain.bigend.vect._0_8_ = in_stack_fffffffffffff858;
      geom_00.domain._20_8_ = in_stack_fffffffffffff860;
      ComputeEdgeState(&local_704,ncomp,&local_528,&local_468,&local_4a8,&local_4e8,&local_270,
                       &local_1f0,&local_230,&local_6a0,&local_410,geom_00,local_660,d_bc,local_6a8,
                       is_velocity);
    }
    local_528.p = local_468.p;
    local_528.jstride = local_468.jstride;
    local_528.kstride = local_468.kstride;
    local_528.nstride = local_468.nstride;
    local_528.begin.z = local_468.begin.z;
    local_528.begin.x = local_468.begin.x;
    local_528.begin.y = local_468.begin.y;
    local_528.end.z = local_468.end.z;
    local_528.end.x = local_468.end.x;
    local_528.end.y = local_468.end.y;
    local_528.ncomp = local_468.ncomp;
    local_6a0.p = local_4a8.p;
    local_6a0.jstride = local_4a8.jstride;
    local_6a0.kstride = local_4a8.kstride;
    local_6a0.nstride = local_4a8.nstride;
    local_6a0.begin.z = local_4a8.begin.z;
    local_6a0.end.z = local_4a8.end.z;
    local_6a0.end.x = local_4a8.end.x;
    local_6a0.end.y = local_4a8.end.y;
    local_6a0.ncomp = local_4a8.ncomp;
    local_410.p = local_4e8.p;
    local_410.jstride = local_4e8.jstride;
    local_410.kstride = local_4e8.kstride;
    local_410.nstride = local_4e8.nstride;
    local_410.begin.z = local_4e8.begin.z;
    local_410.end.z = local_4e8.end.z;
    local_410.end.x = local_4e8.end.x;
    local_410.end.y = local_4e8.end.y;
    local_410.ncomp = local_4e8.ncomp;
    in_stack_fffffffffffff858 = &local_6a0;
    in_stack_fffffffffffff848 = &local_230;
    in_stack_fffffffffffff840 = 0x299be7;
    in_stack_fffffffffffff850 = (Array4<double> *)&local_528;
    in_stack_fffffffffffff860 = &local_410;
    HydroUtils::ComputeFluxes
              (&local_704,&local_370,&local_2f0,&local_330,&local_270,&local_1f0,
               in_stack_fffffffffffff848,&local_528,in_stack_fffffffffffff858,&local_410,geom,ncomp,
               true);
    this = local_658;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((Array4<double> *)&local_528,local_658,(MFIter *)&u,aofs_comp);
    local_6a0.p = local_370.p;
    local_6a0.jstride = local_370.jstride;
    local_6a0.kstride = local_370.kstride;
    local_6a0.nstride = local_370.nstride;
    local_6a0.begin.z = local_370.begin.z;
    local_6a0.begin.x = local_370.begin.x;
    local_6a0.begin.y = local_370.begin.y;
    local_6a0.end.z = local_370.end.z;
    local_6a0.end.x = local_370.end.x;
    local_6a0.end.y = local_370.end.y;
    local_6a0.ncomp = local_370.ncomp;
    local_410.p = local_2f0.p;
    local_410.jstride = local_2f0.jstride;
    local_410.kstride = local_2f0.kstride;
    local_410.nstride = local_2f0.nstride;
    local_410.begin.z = local_2f0.begin.z;
    local_410.begin.x = local_2f0.begin.x;
    local_410.begin.y = local_2f0.begin.y;
    local_410.end.z = local_2f0.end.z;
    local_410.end.x = local_2f0.end.x;
    local_410.end.y = local_2f0.end.y;
    local_410.ncomp = local_2f0.ncomp;
    local_2b0.p = local_330.p;
    local_2b0.jstride = local_330.jstride;
    local_2b0.kstride = local_330.kstride;
    local_2b0.nstride = local_330.nstride;
    local_2b0.begin.z = local_330.begin.z;
    local_2b0.begin.x = local_330.begin.x;
    local_2b0.begin.y = local_330.begin.y;
    local_2b0.end.z = local_330.end.z;
    local_2b0.end.x = local_330.end.x;
    local_2b0.end.y = local_330.end.y;
    local_2b0.ncomp = local_330.ncomp;
    HydroUtils::ComputeDivergence
              (&local_704,(Array4<double> *)&local_528,&local_6a0,&local_410,&local_2b0,ncomp,geom,
               -1.0,true);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((Array4<double> *)&local_528,this,(MFIter *)&u,aofs_comp);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((Array4<double> *)&local_6a0,&divu_mac.super_FabArray<amrex::FArrayBox>,(MFIter *)&u)
    ;
    lVar12 = (long)local_528.begin.x;
    local_5c8 = (long)local_528.begin.z;
    local_560 = (long)local_704.smallend.vect[0];
    local_608 = (long)local_704.smallend.vect[2];
    local_5c0 = local_528.kstride;
    local_5d8 = local_528.kstride * 8;
    local_5d0 = local_6a0.kstride * 8;
    local_6b0 = local_4e8.kstride * 8;
    local_6b8 = local_4e8.p + (local_560 - local_4e8.begin.x);
    local_6c8 = (local_608 - local_4e8.begin.z) * local_6b0 + local_560 * 8 +
                (long)local_4e8.begin.x * -8 + (long)local_4e8.p;
    local_5e0 = local_4a8.kstride * 8;
    local_5e8 = (long)local_468.begin.z;
    local_5f0 = local_468.kstride;
    local_5f8 = local_468.kstride * 8;
    local_538 = local_560 - lVar12;
    local_618 = local_528.p;
    local_6c0 = (local_608 - local_5c8) * local_5d8 + local_560 * 8 + lVar12 * -8 +
                (long)local_528.p;
    local_610 = (local_608 - local_6a0.begin.z) * local_5d0 + local_560 * 8 +
                (long)local_6a0.begin.x * -8 + (long)local_6a0.p;
    local_568 = local_6a0.jstride * 8;
    local_620 = local_4e8.nstride * 8;
    local_570 = local_4e8.jstride * 8;
    local_6d0 = (local_608 - local_4a8.begin.z) * local_5e0 + local_560 * 8 +
                (long)local_4a8.begin.x * -8 + (long)local_4a8.p;
    local_628 = local_4a8.nstride * 8;
    local_578 = local_4a8.jstride * 8;
    local_630 = local_468.p;
    local_6d8 = (local_608 - local_5e8) * local_5f8 + local_560 * 8 + (long)local_468.begin.x * -8 +
                (long)local_468.p;
    uVar16 = (local_704.smallend.vect[0] - local_468.begin.x) + 1;
    local_530 = (ulong)uVar16;
    local_5a8 = (long)local_704.bigend.vect[2];
    local_640 = local_528.nstride;
    local_648 = local_528.nstride * 8;
    local_588 = local_528.jstride;
    local_590 = local_528.jstride * 8;
    local_638 = local_468.nstride;
    local_650 = local_468.nstride * 8;
    local_580 = local_468.jstride;
    local_598 = local_468.jstride * 8;
    uVar6 = 0;
    while (uVar18 = uVar6, uVar18 != local_600) {
      local_5b0 = local_528.p + uVar18 * local_528.nstride;
      local_5b8 = local_468.p + uVar18 * local_468.nstride;
      local_740 = local_6d8;
      local_748 = local_6d0;
      local_750 = local_6c8;
      local_760 = local_6c0;
      lVar11 = local_608;
      local_758 = local_610;
      local_76c = local_704.smallend.vect[2] - local_4e8.begin.z;
      while (local_76c = local_76c + 1, lVar11 <= local_5a8) {
        local_5a0 = lVar11 + 1;
        local_548 = local_5b0 + (lVar11 - local_5c8) * local_528.kstride;
        local_550 = local_5b8 + (lVar11 - local_5e8) * local_468.kstride;
        local_540 = (double *)(local_76c * local_6b0 + (long)local_6b8);
        iVar7 = local_704.smallend.vect[1];
        while (iVar7 <= local_704.bigend.vect[1]) {
          if (local_704.bigend.vect[0] < local_704.smallend.vect[0]) {
            iVar7 = iVar7 + 1;
          }
          else {
            iVar4 = local_6a8[uVar18];
            iVar9 = iVar7 - local_528.begin.y;
            iVar10 = iVar7 - local_468.begin.y;
            iVar14 = iVar7 - local_4a8.begin.y;
            iVar1 = iVar7 + 1;
            lVar20 = (iVar7 - local_4e8.begin.y) * local_570;
            iVar8 = iVar7 - local_6a0.begin.y;
            lVar13 = iVar9 * local_590 + local_760;
            lVar21 = 0;
            lVar11 = local_560;
            do {
              if (iVar4 == 0) {
                lVar19 = local_538 + lVar21;
                dVar3 = ((*(double *)(lVar20 + local_750 + lVar21 * 8) +
                          *(double *)((long)local_540 + lVar21 * 8 + lVar20) +
                         *(double *)(iVar10 * local_598 + local_740 + lVar21 * 8) +
                         local_550[local_468.jstride * iVar10 + (long)(int)(uVar16 + (int)lVar21)] +
                         *(double *)(iVar14 * local_578 + local_748 + lVar21 * 8) +
                         *(double *)
                          ((iVar1 - local_4a8.begin.y) * local_578 + local_748 + lVar21 * 8)) / 6.0)
                        * *(double *)(iVar8 * local_568 + local_758 + lVar21 * 8) +
                        *(double *)(lVar13 + lVar21 * 8);
                *(double *)(lVar13 + lVar21 * 8) = dVar3;
              }
              else {
                lVar19 = lVar11 - lVar12;
                dVar3 = *(double *)(lVar13 + lVar21 * 8);
              }
              local_548[local_528.jstride * iVar9 + lVar19] = -dVar3;
              lVar21 = lVar21 + 1;
              lVar11 = lVar11 + 1;
              iVar7 = iVar1;
            } while ((local_704.bigend.vect[0] - local_704.smallend.vect[0]) + 1 != (int)lVar21);
          }
        }
        local_760 = local_760 + local_5d8;
        local_758 = local_758 + local_5d0;
        local_750 = local_750 + local_6b0;
        local_748 = local_748 + local_5e0;
        local_740 = local_740 + local_5f8;
        lVar11 = local_5a0;
      }
      local_6c0 = local_6c0 + local_648;
      local_6b8 = local_6b8 + local_4e8.nstride;
      local_6c8 = local_6c8 + local_620;
      local_6d0 = local_6d0 + local_628;
      local_6d8 = local_6d8 + local_650;
      local_558 = uVar18;
      uVar6 = uVar18 + 1;
    }
    amrex::Gpu::Device::streamSynchronize();
    amrex::MFIter::operator++((MFIter *)&u);
  }
  amrex::MFIter::~MFIter((MFIter *)&u);
  amrex::MultiFab::~MultiFab(&divu_mac);
  amrex::PODVector<int,_std::allocator<int>_>::~PODVector(&iconserv_d);
  return;
}

Assistant:

void
BDS::ComputeAofs ( MultiFab& aofs,
                   const int aofs_comp,
                   const int ncomp,
                   MultiFab const& state,
                   const int state_comp,
                   AMREX_D_DECL( MultiFab const& umac,
                                 MultiFab const& vmac,
                                 MultiFab const& wmac),
                   AMREX_D_DECL( MultiFab& xedge,
                                 MultiFab& yedge,
                                 MultiFab& zedge),
                   const int  edge_comp,
                   const bool known_edgestate,
                   AMREX_D_DECL( MultiFab& xfluxes,
                                 MultiFab& yfluxes,
                                 MultiFab& zfluxes),
                   int fluxes_comp,
                   MultiFab const& fq,
                   const int fq_comp,
                   MultiFab const& divu,
                   BCRec const* d_bc,
                   Geometry const& geom,
                   Vector<int>& iconserv,
                   const Real dt,
                   const bool is_velocity)
{

    BL_PROFILE("BDS::ComputeAofs()");
    amrex::ignore_unused(divu);

    bool fluxes_are_area_weighted = true;

    // Make a device copy of the iconserv vector for use in kernels
    Gpu::DeviceVector<int> iconserv_d(iconserv.size());
    Gpu::copy(Gpu::hostToDevice, iconserv.begin(), iconserv.end(), iconserv_d.begin());
    int const* iconserv_ptr = iconserv_d.data();

    // If we need convective form, we must also compute div(u_mac)
    MultiFab divu_mac(state.boxArray(),state.DistributionMap(),1,0);;
    for (Long i = 0; i < iconserv.size(); ++i)
    {
        if (!iconserv[i])
        {
            Array<MultiFab const*,AMREX_SPACEDIM> u;
            AMREX_D_TERM(u[0] = &umac;,
                         u[1] = &vmac;,
                         u[2] = &wmac;);
            amrex::computeDivergence(divu_mac,u,geom);

            break;
        }
    }

#if (AMREX_SPACEDIM==2)
    if ( geom.IsRZ() )
    {
        Abort("BDS does not currently support cylindrical coordinates");
    }
#endif

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(aofs,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {

        const Box& bx   = mfi.tilebox();

        //
        // Get handlers to Array4
        //
        AMREX_D_TERM( const auto& fx = xfluxes.array(mfi,fluxes_comp);,
                      const auto& fy = yfluxes.array(mfi,fluxes_comp);,
                      const auto& fz = zfluxes.array(mfi,fluxes_comp););

        AMREX_D_TERM( const auto& xed = xedge.array(mfi,edge_comp);,
                      const auto& yed = yedge.array(mfi,edge_comp);,
                      const auto& zed = zedge.array(mfi,edge_comp););

        AMREX_D_TERM( const auto& u = umac.const_array(mfi);,
                      const auto& v = vmac.const_array(mfi);,
                      const auto& w = wmac.const_array(mfi););

        if ( !known_edgestate ) {
            BDS::ComputeEdgeState( bx, ncomp,
                                   state.array(mfi, state_comp),
                                   AMREX_D_DECL(xed, yed, zed),
                                   AMREX_D_DECL(u, v, w),
                                   divu.array(mfi),
                                   fq.array(mfi, fq_comp),
                                   geom, dt, d_bc, iconserv_ptr,
                                   is_velocity);
        }



        // Compute -div instead of computing div -- this is just for consistency
        // with the way we HAVE to do it for EB (because redistribution operates on
        // -div rather than div)
        Real mult = -1.0;

        HydroUtils::ComputeFluxes( bx,
                                   AMREX_D_DECL( fx, fy, fz ),
                                   AMREX_D_DECL( u, v, w ),
                                   AMREX_D_DECL( xed, yed, zed ),
                                   geom, ncomp, fluxes_are_area_weighted );

        HydroUtils::ComputeDivergence( bx,
                                       aofs.array(mfi,aofs_comp),
                                       AMREX_D_DECL( fx, fy, fz ),
                                       ncomp, geom,
                                       mult, fluxes_are_area_weighted);


        // Compute the convective form if needed and
        // flip the sign to return div
        auto const& aofs_arr  = aofs.array(mfi, aofs_comp);
        auto const& divu_arr  = divu_mac.array(mfi);
        amrex::ParallelFor(bx, ncomp, [=]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            if (!iconserv_ptr[n])
            {
                Real q = xed(i,j,k,n) + xed(i+1,j,k,n)
                       + yed(i,j,k,n) + yed(i,j+1,k,n);
#if (AMREX_SPACEDIM == 2)
                q *= 0.25;
#else
                q += zed(i,j,k,n) + zed(i,j,k+1,n);
                q /= 6.0;
#endif
                aofs_arr(i,j,k,n) += q*divu_arr(i,j,k);
            }

            aofs_arr( i, j, k, n ) *=  - 1.0;
        });

        //
        // NOTE this sync cannot protect temporaries in ComputeEdgeState, ComputeFluxes
        // or ComputeDivergence, since functions have their own scope. As soon as the
        // CPU hits the end of the function, it will call the destructor for all
        // temporaries created in that function.
        //
        Gpu::streamSynchronize();  // otherwise we might be using too much memory
    }

}